

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

int brtrimws(bstring b)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  ushort **ppuVar6;
  uchar *puVar7;
  ulong uVar8;
  
  iVar5 = -1;
  if (((b != (bstring)0x0) && (puVar7 = b->data, puVar7 != (uchar *)0x0)) &&
     (iVar2 = b->mlen, 0 < iVar2)) {
    uVar3 = b->slen;
    if (((int)uVar3 <= iVar2) && (uVar4 = (ulong)uVar3, -1 < (int)uVar3)) {
      do {
        uVar8 = uVar4;
        if ((long)uVar8 < 1) {
          uVar8 = 0;
          goto LAB_001141ac;
        }
        uVar1 = puVar7[uVar8 - 1];
        if ((long)(char)uVar1 < 0) break;
        ppuVar6 = __ctype_b_loc();
        uVar4 = uVar8 - 1;
      } while ((*(byte *)((long)*ppuVar6 + (long)(char)uVar1 * 2 + 1) & 0x20) != 0);
      if ((int)uVar8 <= iVar2) {
        puVar7 = puVar7 + (uVar8 & 0xffffffff);
LAB_001141ac:
        *puVar7 = '\0';
      }
      b->slen = (int)uVar8;
      iVar5 = 0;
    }
  }
  return iVar5;
}

Assistant:

int brtrimws (bstring b) {
int i;

	if (b == NULL || b->data == NULL || b->mlen < b->slen ||
	    b->slen < 0 || b->mlen <= 0) return BSTR_ERR;

	for (i = b->slen - 1; i >= 0; i--) {
		if (!wspace (b->data[i])) {
			if (b->mlen > i) b->data[i+1] = (unsigned char) '\0';
			b->slen = i + 1;
			return 0;
		}
	}

	b->data[0] = (unsigned char) '\0';
	b->slen = 0;
	return 0;
}